

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThan,true,false,true,false>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  int64_t *piVar4;
  int64_t lmonths;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  idx_t iVar12;
  long lVar13;
  sel_t sVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  int64_t ldays;
  int64_t lmicros;
  interval_t *input;
  
  if (count + 0x3f < 0x40) {
    iVar12 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar12 = 0;
    uVar7 = 0;
    uVar8 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar5 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar5 = count;
        }
LAB_0042e55e:
        uVar11 = uVar8;
        if (uVar8 < uVar5) {
          lVar9 = ldata->micros;
          psVar2 = sel->sel_vector;
          lVar15 = (long)ldata->days + lVar9 / 86400000000;
          lVar10 = lVar15 % 0x1e;
          lVar15 = (long)ldata->months + lVar15 / 0x1e;
          psVar3 = true_sel->sel_vector;
          piVar4 = &rdata[uVar8].micros;
          do {
            uVar6 = uVar8;
            if (psVar2 != (sel_t *)0x0) {
              uVar6 = (ulong)psVar2[uVar8];
            }
            lVar13 = (long)*(int32_t *)((long)piVar4 + -4) + *piVar4 / 86400000000;
            lVar16 = lVar13 % 0x1e;
            lVar13 = (long)((interval_t *)(piVar4 + -1))->months + lVar13 / 0x1e;
            uVar11 = 1;
            if (lVar15 <= lVar13) {
              if (lVar15 < lVar13) {
                uVar11 = 0;
              }
              else if (lVar10 <= lVar16) {
                uVar11 = (ulong)(*piVar4 % 86400000000 < lVar9 % 86400000000 && lVar16 <= lVar10);
              }
            }
            psVar3[iVar12] = (sel_t)uVar6;
            iVar12 = uVar11 + iVar12;
            uVar8 = uVar8 + 1;
            piVar4 = piVar4 + 2;
            uVar11 = uVar5;
          } while (uVar5 != uVar8);
        }
      }
      else {
        uVar6 = puVar1[uVar7];
        uVar5 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar5 = count;
        }
        uVar11 = uVar5;
        if (uVar6 != 0) {
          if (uVar6 == 0xffffffffffffffff) goto LAB_0042e55e;
          uVar11 = uVar8;
          if (uVar8 < uVar5) {
            psVar2 = sel->sel_vector;
            psVar3 = true_sel->sel_vector;
            piVar4 = &rdata[uVar8].micros;
            uVar17 = 0;
            do {
              if (psVar2 == (sel_t *)0x0) {
                sVar14 = (int)uVar8 + (int)uVar17;
              }
              else {
                sVar14 = psVar2[uVar8 + uVar17];
              }
              if ((uVar6 >> (uVar17 & 0x3f) & 1) == 0) {
                uVar11 = 0;
              }
              else {
                lVar9 = (long)ldata->days + ldata->micros / 86400000000;
                lVar15 = lVar9 % 0x1e;
                lVar16 = (long)ldata->months + lVar9 / 0x1e;
                lVar10 = (long)*(int32_t *)((long)piVar4 + -4) + *piVar4 / 86400000000;
                lVar9 = lVar10 % 0x1e;
                lVar10 = (long)((interval_t *)(piVar4 + -1))->months + lVar10 / 0x1e;
                uVar11 = 1;
                if (lVar16 <= lVar10) {
                  if (lVar16 < lVar10) {
                    uVar11 = 0;
                  }
                  else if (lVar15 <= lVar9) {
                    uVar11 = (ulong)(*piVar4 % 86400000000 < ldata->micros % 86400000000 &&
                                    lVar9 <= lVar15);
                  }
                }
              }
              psVar3[iVar12] = sVar14;
              iVar12 = uVar11 + iVar12;
              uVar17 = uVar17 + 1;
              piVar4 = piVar4 + 2;
              uVar11 = uVar5;
            } while (uVar5 - uVar8 != uVar17);
          }
        }
      }
      uVar7 = uVar7 + 1;
      uVar8 = uVar11;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return iVar12;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}